

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O0

double __thiscall IntVar::getScore(IntVar *this,VarBranch vb)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  iterator *this_00;
  char *pcVar5;
  undefined4 in_ESI;
  long in_RDI;
  longdouble in_ST0;
  iterator iVar6;
  char *local_98;
  IntVar *in_stack_ffffffffffffff70;
  FILE *__stream;
  int local_80;
  int local_7c;
  iterator local_48;
  IntVar *local_38;
  int local_30;
  IntVar *local_28;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  double local_8;
  
  switch(in_ESI) {
  case 2:
    iVar4 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0xc));
    iVar2 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x10));
    local_8 = (double)(iVar4 - iVar2);
    break;
  case 3:
    iVar4 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x10));
    iVar2 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0xc));
    local_8 = (double)(iVar4 - iVar2);
    break;
  case 4:
    iVar4 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0xc));
    local_8 = (double)-iVar4;
    break;
  case 5:
    iVar4 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0xc));
    local_8 = (double)iVar4;
    break;
  case 6:
    iVar4 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x10));
    local_8 = (double)-iVar4;
    break;
  case 7:
    iVar4 = Tint::operator_cast_to_int((Tint *)(in_RDI + 0x10));
    local_8 = (double)iVar4;
    break;
  case 8:
    uVar3 = vec<IntVar::PropInfo>::size((vec<IntVar::PropInfo> *)(in_RDI + 0x48));
    local_8 = -(double)uVar3;
    break;
  case 9:
    uVar3 = vec<IntVar::PropInfo>::size((vec<IntVar::PropInfo> *)(in_RDI + 0x48));
    local_8 = (double)uVar3;
    break;
  case 10:
    bVar1 = isFixed(in_stack_ffffffffffffff70);
    if (bVar1) {
      local_7c = 0;
    }
    else {
      if (*(long *)(in_RDI + 0x28) == 0) {
        local_80 = 1;
      }
      else {
        iVar6 = begin(in_stack_ffffffffffffff70);
        local_38 = iVar6.var;
        local_30 = iVar6.val;
        local_28 = local_38;
        this_00 = iterator::operator++((iterator *)in_stack_ffffffffffffff70);
        local_80 = iterator::operator*(this_00);
        iVar6 = begin(in_stack_ffffffffffffff70);
        local_48.var = iVar6.var;
        local_48.val = iVar6.val;
        iVar4 = iterator::operator*(&local_48);
        local_80 = local_80 - iVar4;
      }
      local_7c = local_80;
    }
    local_8 = (double)local_7c;
    break;
  default:
    __stream = _stderr;
    pcVar5 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/vars/int-var.cpp"
                     ,0x2f);
    if (pcVar5 == (char *)0x0) {
      local_98 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/vars/int-var.cpp"
      ;
    }
    else {
      local_98 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/chuffed[P]chuffed/chuffed/vars/int-var.cpp"
                         ,0x2f);
      local_98 = local_98 + 1;
    }
    fprintf(__stream,"%s:%d: ",local_98,0x102);
    fprintf(_stderr,"Not yet supported\n");
    abort();
  case 0xc:
    MIP::getRC((MIP *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
               (IntVar *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    local_8 = (double)in_ST0;
    break;
  case 0xe:
    local_8 = *(double *)(in_RDI + 0x38);
  }
  return local_8;
}

Assistant:

double IntVar::getScore(VarBranch vb) {
	switch (vb) {
		case VAR_MIN_MIN:
			return -min;
		case VAR_MIN_MAX:
			return min;
		case VAR_MAX_MIN:
			return -max;
		case VAR_MAX_MAX:
			return max;
#if INT_BRANCH_HOLES
		// note slight inconsistency, if INT_BRANCH_HOLES=0 then we
		// use the domain size-1, same behaviour but more efficient?
		case VAR_SIZE_MIN:
			return vals ? -size() : min - (max + 1);
		case VAR_SIZE_MAX:
			return vals ? size() : max + 1 - min;
#else
		case VAR_SIZE_MIN:
			return min - max;
		case VAR_SIZE_MAX:
			return max - min;
#endif
		case VAR_DEGREE_MIN:
			return -static_cast<double>(pinfo.size());
		case VAR_DEGREE_MAX:
			return pinfo.size();
		case VAR_REDUCED_COST:
			return mip->getRC(this);
		case VAR_ACTIVITY:
			return activity;
		case VAR_REGRET_MIN_MAX:
			return isFixed() ? 0 : (vals != nullptr ? *++begin() - *begin() : 1);
#ifdef HAS_VAR_IMPACT
		case VAR_IMPACT:
			return isFixed() ? 0 : impact;
#endif

		default:
			NOT_SUPPORTED;
	}
}